

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

char * ssh1_pubkey_str(RSAKey *key)

{
  char *ptr;
  char *ptr_00;
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  
  ptr = mp_get_decimal(key->exponent);
  ptr_00 = mp_get_decimal(key->modulus);
  sVar1 = mp_get_nbits(key->modulus);
  pcVar3 = key->comment;
  pcVar2 = " ";
  if (pcVar3 == (char *)0x0) {
    pcVar2 = anon_var_dwarf_3405d + 10;
    pcVar3 = anon_var_dwarf_3405d + 10;
  }
  pcVar3 = dupprintf("%zu %s %s%s%s",sVar1,ptr,ptr_00,pcVar2,pcVar3);
  safefree(ptr);
  safefree(ptr_00);
  return pcVar3;
}

Assistant:

char *ssh1_pubkey_str(RSAKey *key)
{
    char *buffer;
    char *dec1, *dec2;

    dec1 = mp_get_decimal(key->exponent);
    dec2 = mp_get_decimal(key->modulus);
    buffer = dupprintf("%"SIZEu" %s %s%s%s", mp_get_nbits(key->modulus),
                       dec1, dec2, key->comment ? " " : "",
                       key->comment ? key->comment : "");
    sfree(dec1);
    sfree(dec2);
    return buffer;
}